

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::Formatter::operator()
          (Formatter *this,char *format,EnumDescriptor **args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  Printer *this_00;
  pointer pcVar1;
  long lVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_81;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  string local_68;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  this_00 = this->printer_;
  Payload<google::protobuf::EnumDescriptor>(&local_68,*args);
  local_48[0] = local_38;
  pcVar1 = (args_1->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar1,pcVar1 + args_1->_M_string_length);
  __l._M_len = 2;
  __l._M_array = &local_68;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_80,__l,&local_81);
  io::Printer::FormatInternal(this_00,&local_80,&this->vars_,format);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_80);
  lVar2 = 0;
  do {
    if (local_38 + lVar2 != *(undefined1 **)((long)local_48 + lVar2)) {
      operator_delete(*(undefined1 **)((long)local_48 + lVar2));
    }
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x40);
  return;
}

Assistant:

void operator()(const char* format, const Args&... args) const {
    printer_->FormatInternal({ToString(args)...}, vars_, format);
  }